

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

ON_OBSOLETE_V5_TextExtra *
ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject *pText,bool bCreate)

{
  bool bVar1;
  ON_UserData *p;
  ON_OBSOLETE_V5_TextExtra *pOVar2;
  ON_UUID local_28;
  
  if (pText != (ON_OBSOLETE_V5_TextObject *)0x0) {
    local_28 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_TextExtra_class_rtti);
    p = ON_Object::GetUserData((ON_Object *)pText,&local_28);
    pOVar2 = Cast(&p->super_ON_Object);
    if (!bCreate || pOVar2 != (ON_OBSOLETE_V5_TextExtra *)0x0) {
      return pOVar2;
    }
    pOVar2 = (ON_OBSOLETE_V5_TextExtra *)operator_new(0xf0);
    ON_OBSOLETE_V5_TextExtra(pOVar2);
    bVar1 = ON_Object::AttachUserData((ON_Object *)pText,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_OBSOLETE_V5_TextExtra *)0x0;
}

Assistant:

ON_OBSOLETE_V5_TextExtra* ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject* pText, bool bCreate)
{
  ON_OBSOLETE_V5_TextExtra* pExtra = 0;
  if(pText)
  {
    pExtra = ON_OBSOLETE_V5_TextExtra::Cast(pText->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_TextExtra)));
    if(pExtra == 0 && bCreate)
    {
      pExtra = new ON_OBSOLETE_V5_TextExtra;
      if(pExtra)
      {
        if(!pText->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}